

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
mapbox::
earcut<unsigned_int,std::vector<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>,std::allocator<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,mapbox *this,
          vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
          *poly)

{
  Earcut<unsigned_int> earcut;
  
  earcut.indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  earcut.vertices = 0;
  earcut.indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  earcut.indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  earcut.inv_size = 0.0;
  earcut.nodes.currentBlock = (Node *)0x0;
  earcut.nodes.currentIndex = 1;
  earcut.nodes.blockSize = 1;
  earcut.nodes.allocations.
  super__Vector_base<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  earcut.nodes.allocations.
  super__Vector_base<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  earcut.nodes.allocations.
  super__Vector_base<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  detail::Earcut<unsigned_int>::operator()
            (&earcut,(vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                      *)this);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start =
       earcut.indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       earcut.indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       earcut.indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  earcut.indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  earcut.indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  earcut.indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  detail::Earcut<unsigned_int>::~Earcut(&earcut);
  return __return_storage_ptr__;
}

Assistant:

std::vector<N> earcut(const Polygon& poly) {
    mapbox::detail::Earcut<N> earcut;
    earcut(poly);
    return std::move(earcut.indices);
}